

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

btree_result
btree_init(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
          uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  btree_result bVar4;
  ushort *puVar5;
  size_t sVar6;
  bnode *node;
  ulong uVar7;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    uVar7 = 0x11;
  }
  else {
    btree->root_flag = flag | 3;
    uVar7 = (ulong)(meta->size + 0x11 & 0xfffffff0) + 0x11;
  }
  bVar4 = BTREE_RESULT_FAIL;
  if ((uint)uVar7 <= nodesize) {
    if ((blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
       (blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0)) {
      puVar5 = (ushort *)(*blk_ops->blk_alloc)(blk_handle,&btree->root_bid);
    }
    else {
      puVar5 = (ushort *)(*blk_ops->blk_alloc_sub)(blk_handle,&btree->root_bid);
      if ((meta != (btree_meta *)0x0) &&
         (sVar6 = (*btree->blk_ops->blk_get_size)(btree->blk_handle,btree->root_bid), sVar6 < uVar7)
         ) {
        puVar5 = (ushort *)
                 (*btree->blk_ops->blk_enlarge_node)
                           (btree->blk_handle,btree->root_bid,uVar7,&btree->root_bid);
      }
    }
    uVar1 = btree->root_flag;
    uVar2._0_1_ = btree->ksize;
    uVar2._1_1_ = btree->vsize;
    *puVar5 = uVar2 << 8 | uVar2 >> 8;
    puVar5[2] = 1;
    puVar5[3] = 0;
    puVar5[1] = uVar1;
    puVar3 = puVar5;
    if (meta != (btree_meta *)0x0 && (uVar1 & 2) != 0) {
      puVar5[8] = meta->size << 8 | meta->size >> 8;
      memcpy(puVar5 + 9,meta->data,(ulong)meta->size);
      puVar3 = (ushort *)((ulong)(meta->size + 0x11 & 0xfffffff0) + (long)puVar5);
    }
    *(ushort **)(puVar5 + 4) = puVar3 + 8;
    bVar4 = BTREE_RESULT_SUCCESS;
  }
  return bVar4;
}

Assistant:

btree_result btree_init(
        struct btree *btree, void *blk_handle,
        struct btree_blk_ops *blk_ops,     struct btree_kv_ops *kv_ops,
        uint32_t nodesize, uint8_t ksize, uint8_t vsize,
        bnode_flag_t flag, struct btree_meta *meta)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // create the first root node
    if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
        addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);
        if (meta) {
            // check if the initial node size including metadata is
            // larger than the subblock size
            size_t subblock_size;
            subblock_size = btree->blk_ops->blk_get_size(btree->blk_handle,
                                                         btree->root_bid);
            if (subblock_size < min_nodesize) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        min_nodesize,
                                                        &btree->root_bid);
            }
        }
    } else {
        addr = btree->blk_ops->blk_alloc (btree->blk_handle, &btree->root_bid);
    }
    _btree_init_node(btree, btree->root_bid, addr,
                     btree->root_flag, BNODE_MASK_ROOT, meta);

    return BTREE_RESULT_SUCCESS;
}